

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alpha_enc.c
# Opt level: O2

int CompressAlphaJob(void *arg1,void *unused)

{
  uint method;
  uint uVar1;
  uint dst_stride;
  uint height;
  WebPPicture *pic;
  WebPAuxStats *pWVar2;
  WebPEncodingError error;
  int iVar3;
  int iVar4;
  WEBP_FILTER_TYPE WVar5;
  uint8_t *dst;
  ulong uVar6;
  long lVar7;
  uint8_t *puVar8;
  ulong uVar9;
  char cVar10;
  uint uVar11;
  ulong uVar12;
  size_t size;
  ulong uVar13;
  int filter;
  uint64_t local_238;
  FilterTrial best;
  uint8_t color [256];
  
  lVar7 = *arg1;
  pic = *(WebPPicture **)((long)arg1 + 8);
  iVar3 = *(int *)(lVar7 + 8);
  method = *(uint *)(lVar7 + 0x30);
  uVar1 = *(uint *)(lVar7 + 0x38);
  dst_stride = pic->width;
  height = pic->height;
  local_238 = 0;
  if ((uVar1 < 0x65) && (method < 2)) {
    cVar10 = (*(int *)(lVar7 + 0x34) == 1) + '\x05';
    size = (long)(int)height * (long)(int)dst_stride;
    if (*(int *)(lVar7 + 0x34) == 0) {
      cVar10 = '\0';
    }
    if (method == 0) {
      cVar10 = '\0';
    }
    dst = (uint8_t *)WebPSafeMalloc(1,size);
    if (dst != (uint8_t *)0x0) {
      WebPCopyPlane(pic->a,pic->a_stride,dst,dst_stride,dst_stride,height);
      if ((int)uVar1 < 100) {
        if (uVar1 < 0x47) {
          uVar11 = (uint)(byte)((char)(((ushort)uVar1 & 0xff) / 5) + 2);
        }
        else {
          uVar11 = uVar1 * 8 - 0x220;
        }
        iVar4 = QuantizeLevels(dst,dst_stride,height,uVar11,&local_238);
        if (iVar4 != 0) goto LAB_00128b22;
        puVar8 = (uint8_t *)0x0;
        uVar6 = 0;
        iVar3 = 0;
      }
      else {
LAB_00128b22:
        VP8FiltersInit();
        pWVar2 = pic->stats;
        if (cVar10 == '\0') {
          uVar11 = 1;
        }
        else if (cVar10 == '\x06') {
          uVar12 = 0;
          memset(color,0,0x100);
          uVar6 = 0;
          if (0 < (int)dst_stride) {
            uVar6 = (ulong)dst_stride;
          }
          uVar9 = 0;
          puVar8 = dst;
          if (0 < (int)height) {
            uVar9 = (ulong)height;
          }
          for (; uVar12 != uVar9; uVar12 = uVar12 + 1) {
            for (uVar13 = 0; uVar6 != uVar13; uVar13 = uVar13 + 1) {
              color[puVar8[uVar13]] = '\x01';
            }
            puVar8 = puVar8 + (int)dst_stride;
          }
          uVar11 = 0;
          for (lVar7 = 0; lVar7 != 0x100; lVar7 = lVar7 + 1) {
            uVar11 = (uVar11 + 1) - (uint)(color[lVar7] == '\0');
          }
          WVar5 = WEBP_FILTER_NONE;
          if (0x10 < uVar11) {
            WVar5 = WebPEstimateBestFilter(dst,dst_stride,height,dst_stride);
          }
          uVar11 = (uint)(0xc0 < uVar11 || 3 < iVar3) | 1 << (WVar5 & 0x1f);
        }
        else {
          uVar11 = 0xf;
        }
        best.score = 0xffffffff;
        VP8BitWriterInit(&best.bw,0);
        if (uVar11 == 1) {
          iVar4 = EncodeAlphaInternal(dst,dst_stride,height,method,0,(uint)((int)uVar1 < 100),iVar3,
                                      (uint8_t *)0x0,&best);
LAB_00128d49:
          if (iVar4 == 0) {
            VP8BitWriterWipeOut(&best.bw);
            goto LAB_00128da2;
          }
          if (pWVar2 != (WebPAuxStats *)0x0) {
            pWVar2->cross_color_transform_bits = best.stats.cross_color_transform_bits;
            pWVar2->lossless_features = best.stats.lossless_features;
            pWVar2->histogram_bits = best.stats.histogram_bits;
            pWVar2->transform_bits = best.stats.transform_bits;
            pWVar2->cache_bits = best.stats.cache_bits;
            pWVar2->palette_size = best.stats.palette_size;
            pWVar2->lossless_size = best.stats.lossless_size;
            pWVar2->lossless_hdr_size = best.stats.lossless_hdr_size;
            pWVar2->lossless_data_size = best.stats.lossless_data_size;
          }
          iVar3 = 1;
        }
        else {
          puVar8 = (uint8_t *)WebPSafeMalloc(1,size);
          if (puVar8 != (uint8_t *)0x0) {
            filter = 0;
            iVar4 = 1;
            for (; (iVar4 != 0 && (uVar11 != 0)); uVar11 = uVar11 >> 1) {
              iVar4 = 1;
              if ((uVar11 & 1) != 0) {
                iVar4 = EncodeAlphaInternal(dst,dst_stride,height,method,filter,
                                            (uint)((int)uVar1 < 100),iVar3,puVar8,
                                            (FilterTrial *)color);
                if ((iVar4 == 0) || (best.score <= (ulong)color._0_8_)) {
                  VP8BitWriterWipeOut((VP8BitWriter *)(color + 8));
                }
                else {
                  VP8BitWriterWipeOut(&best.bw);
                  memcpy(&best,color,0xf8);
                }
              }
              filter = filter + 1;
            }
            WebPSafeFree(puVar8);
            goto LAB_00128d49;
          }
LAB_00128da2:
          WebPEncodingSetError(pic,VP8_ENC_ERROR_OUT_OF_MEMORY);
          best.bw.buf_ = (uint8_t *)0x0;
          best.bw.pos_ = 0;
          iVar3 = 0;
        }
        pWVar2 = pic->stats;
        uVar6 = best.bw.pos_;
        puVar8 = best.bw.buf_;
        if (pWVar2 != (WebPAuxStats *)0x0) {
          pWVar2->coded_size = pWVar2->coded_size + (int)best.bw.pos_;
          *(uint64_t *)((long)arg1 + 0x5bf0) = local_238;
        }
      }
      WebPSafeFree(dst);
      goto LAB_00128a3d;
    }
    error = VP8_ENC_ERROR_OUT_OF_MEMORY;
  }
  else {
    error = VP8_ENC_ERROR_INVALID_CONFIGURATION;
  }
  iVar3 = WebPEncodingSetError(pic,error);
  puVar8 = (uint8_t *)0x0;
  uVar6 = 0;
LAB_00128a3d:
  iVar4 = 0;
  if (iVar3 != 0) {
    if (uVar6 >> 0x20 == 0) {
      *(int *)((long)arg1 + 0x228) = (int)uVar6;
      *(uint8_t **)((long)arg1 + 0x220) = puVar8;
      iVar4 = 1;
    }
    else {
      WebPSafeFree(puVar8);
      iVar4 = 0;
    }
  }
  return iVar4;
}

Assistant:

static int CompressAlphaJob(void* arg1, void* unused) {
  VP8Encoder* const enc = (VP8Encoder*)arg1;
  const WebPConfig* config = enc->config_;
  uint8_t* alpha_data = NULL;
  size_t alpha_size = 0;
  const int effort_level = config->method;  // maps to [0..6]
  const WEBP_FILTER_TYPE filter =
      (config->alpha_filtering == 0) ? WEBP_FILTER_NONE :
      (config->alpha_filtering == 1) ? WEBP_FILTER_FAST :
                                       WEBP_FILTER_BEST;
  if (!EncodeAlpha(enc, config->alpha_quality, config->alpha_compression,
                   filter, effort_level, &alpha_data, &alpha_size)) {
    return 0;
  }
  if (alpha_size != (uint32_t)alpha_size) {  // Soundness check.
    WebPSafeFree(alpha_data);
    return 0;
  }
  enc->alpha_data_size_ = (uint32_t)alpha_size;
  enc->alpha_data_ = alpha_data;
  (void)unused;
  return 1;
}